

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
flatbuffers::Array<keyfield::sample::Rice,_(unsigned_short)3>::CopyFromSpan
          (Array<keyfield::sample::Rice,_(unsigned_short)3> *this,
          span<const_keyfield::sample::Rice,_3UL> *src)

{
  bool bVar1;
  span<const_keyfield::sample::Rice,_3UL> local_40;
  uint8_t *local_28;
  uint8_t *p2;
  uint8_t *p1;
  span<const_keyfield::sample::Rice,_3UL> *src_local;
  Array<keyfield::sample::Rice,_(unsigned_short)3> *this_local;
  
  p1 = (uint8_t *)src;
  src_local = (span<const_keyfield::sample::Rice,_3UL> *)this;
  p2 = span<const_keyfield::sample::Rice,_3UL>::data(src)->origin_;
  local_28 = Data(this);
  if ((p2 < local_28) || (bVar1 = false, local_28 + 3 <= p2)) {
    bVar1 = local_28 < p2 || p2 + 3 <= local_28;
  }
  if (!bVar1) {
    __assert_fail("!(p1 >= p2 && p1 < (p2 + length)) && !(p2 >= p1 && p2 < (p1 + length))",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/array.h"
                  ,0x6e,
                  "void flatbuffers::Array<keyfield::sample::Rice, 3>::CopyFromSpan(flatbuffers::span<const T, length>) [T = keyfield::sample::Rice, length = 3]"
                 );
  }
  span<const_keyfield::sample::Rice,_3UL>::span(&local_40,src);
  CopyFromSpanImpl(this,&local_40);
  return;
}

Assistant:

void CopyFromSpan(flatbuffers::span<const T, length> src) {
    const auto p1 = reinterpret_cast<const uint8_t *>(src.data());
    const auto p2 = Data();
    FLATBUFFERS_ASSERT(!(p1 >= p2 && p1 < (p2 + length)) &&
                       !(p2 >= p1 && p2 < (p1 + length)));
    (void)p1;
    (void)p2;
    CopyFromSpanImpl(flatbuffers::bool_constant<is_span_observable>(), src);
  }